

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bt_peer_connection.cpp
# Opt level: O0

void __thiscall libtorrent::aux::bt_peer_connection::write_share_mode(bt_peer_connection *this)

{
  bool val;
  element_type *this_00;
  counters *this_01;
  bool bVar1;
  span<const_char> local_68 [2];
  char *local_48;
  char *ptr;
  undefined3 uStack_38;
  char msg [7];
  undefined1 local_20 [8];
  shared_ptr<libtorrent::aux::torrent> t;
  bt_peer_connection *this_local;
  
  t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  peer_connection::associated_torrent((peer_connection *)(msg + 4));
  ::std::weak_ptr<libtorrent::aux::torrent>::lock((weak_ptr<libtorrent::aux::torrent> *)local_20);
  ::std::weak_ptr<libtorrent::aux::torrent>::~weak_ptr
            ((weak_ptr<libtorrent::aux::torrent> *)(msg + 4));
  bVar1 = this->m_share_mode_id != '\0';
  if (bVar1) {
    uStack_38 = 0x14;
    ptr._4_4_ = 0x3000000;
    local_48 = (char *)((long)&uStack_38 + 1);
    write_uint8<unsigned_char,char*>(this->m_share_mode_id,&local_48);
    this_00 = ::std::
              __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_20);
    val = torrent::share_mode(this_00);
    write_uint8<bool,char*>(val,&local_48);
    span<char_const>::span<char,7l>((span<char_const> *)local_68,(char (*) [7])((long)&ptr + 4));
    peer_connection::send_buffer(&this->super_peer_connection,local_68[0]);
    this_01 = peer_connection::stats_counters(&this->super_peer_connection);
    counters::inc_stats_counter(this_01,0x67,1);
  }
  msg[1] = '\0';
  msg[2] = '\0';
  msg[3] = '\0';
  msg[0] = !bVar1;
  ::std::shared_ptr<libtorrent::aux::torrent>::~shared_ptr
            ((shared_ptr<libtorrent::aux::torrent> *)local_20);
  return;
}

Assistant:

void bt_peer_connection::write_share_mode()
	{
		INVARIANT_CHECK;

		auto t = associated_torrent().lock();
		if (m_share_mode_id == 0) return;

		char msg[7] = {0, 0, 0, 3, msg_extended};
		char* ptr = msg + 5;
		aux::write_uint8(m_share_mode_id, ptr);
		aux::write_uint8(t->share_mode(), ptr);
		send_buffer(msg);

		stats_counters().inc_stats_counter(counters::num_outgoing_extended);
	}